

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O1

Variant * Jinx::Impl::CallWith(Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pVVar1;
  _Rb_tree_node_base *p_Var2;
  RuntimeID id;
  char *message;
  Script *this_00;
  Parameters fnParams;
  CollectionPtr collPtr;
  vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> local_78;
  Script *local_60;
  undefined1 local_58 [40];
  
  this_00 = (Script *)(script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  this = (script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  pVVar1 = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 == (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
    message = "\'call with\' function invoked with no parameters";
  }
  else {
    if (pVVar1->m_type == Function) {
      local_78.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pVVar1[1].m_type == Collection) {
        local_60 = this_00;
        Variant::GetCollection((Variant *)local_58);
        for (p_Var2 = *(_Rb_tree_node_base **)(local_58._0_8_ + 0x18);
            p_Var2 != (_Rb_tree_node_base *)(local_58._0_8_ + 8);
            p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
          std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
                    (&local_78,(value_type *)&p_Var2[2]._M_parent);
        }
        this_00 = local_60;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
          this_00 = local_60;
        }
      }
      else {
        std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back(&local_78,pVVar1 + 1)
        ;
      }
      id = Variant::GetFunction
                     ((params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
                      _M_impl.super__Vector_impl_data._M_start);
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::vector
                ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)(local_58 + 0x10),
                 &local_78);
      Script::CallFunction(__return_storage_ptr__,this_00,id,(Parameters *)(local_58 + 0x10));
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector
                ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)(local_58 + 0x10));
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector(&local_78);
      goto LAB_0011b4e3;
    }
    message = "Invalid parameters to \'call with\' function";
  }
  Script::Error(this_00,message);
  __return_storage_ptr__->m_type = Null;
  Variant::SetNull(__return_storage_ptr__);
LAB_0011b4e3:
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant CallWith(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params.empty())
		{
			s->Error("'call with' function invoked with no parameters");
			return nullptr;
		}
		if (!params[0].IsFunction())
		{
			s->Error("Invalid parameters to 'call with' function");
			return nullptr;
		}
		Parameters fnParams;
		if (params[1].IsCollection())
		{
			auto collPtr = params[1].GetCollection();
			auto & coll = *collPtr;
			for (const auto & pair : coll)
				fnParams.push_back(pair.second);
		}
		else
		{
			fnParams.push_back(params[1]);
		}
		return s->CallFunction(params[0].GetFunction(), fnParams);
	}